

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::TempDirDeleter::GetTempDir_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ulong uVar2;
  char *__path;
  LogMessage *pLVar3;
  int *piVar4;
  char *in_RCX;
  string_view contents;
  AlphaNum local_100;
  AlphaNum local_d0;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80 [2];
  char *local_60;
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  string local_38 [32];
  void *local_18;
  TempDirDeleter *this_local;
  
  local_18 = this;
  this_local = (TempDirDeleter *)__return_storage_ptr__;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    GetTemporaryDirectoryName_abi_cxx11_();
    std::__cxx11::string::operator=((string *)this,local_38);
    std::__cxx11::string::~string(local_38);
    File::DeleteRecursively((string *)this,(void *)0x0,(void *)0x0);
    __path = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(__path,0x1ff);
    local_51 = 0;
    if (iVar1 != 0) {
      in_RCX = "mkdir(name_.c_str(), 0777) == 0";
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
                 ,0x82,"mkdir(name_.c_str(), 0777) == 0");
      local_51 = 1;
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      piVar4 = __errno_location();
      local_60 = strerror(*piVar4);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar3,&local_60)
      ;
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
    }
    if ((local_51 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_80,anon_var_dwarf_37cdd0 + 5);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_100,"/TEMP_DIR_FOR_PROTOBUF_TESTS");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)&local_d0,&local_100,(AlphaNum *)in_RCX);
    contents._M_str = (char *)&local_a0;
    contents._M_len = (size_t)local_80[0]._M_str;
    File::WriteStringToFileOrDie((File *)local_80[0]._M_len,contents,(string *)in_RCX);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTempDir() {
    if (name_.empty()) {
      name_ = GetTemporaryDirectoryName();
      File::DeleteRecursively(name_, nullptr, nullptr);
      ABSL_CHECK(mkdir(name_.c_str(), 0777) == 0) << strerror(errno);

      // Stick a file in the directory that tells people what this is, in case
      // we abort and don't get a chance to delete it.
      File::WriteStringToFileOrDie(
          "", absl::StrCat(name_, "/TEMP_DIR_FOR_PROTOBUF_TESTS"));
    }
    return name_;
  }